

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O0

void __thiscall R::R(R *this,Object *obj)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppOVar3;
  Object *dep;
  iterator __end2;
  iterator __begin2;
  set<Object_*,_std::less<Object_*>,_std::allocator<Object_*>_> *__range2;
  string local_38;
  R local_18;
  Object *obj_local;
  R *this_local;
  
  local_18.object = obj;
  obj_local = (Object *)this;
  std::__cxx11::to_string(&local_38,obj->referencesNum + 1);
  SysLog::debug<char[25],Object*,char[17],std::__cxx11::string>
            (&GC::logger,(char (*) [25])"NEW Reference of object ",&local_18.object,
             (char (*) [17])" Reference num: ",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this->object = (Object *)local_18;
  this->object->referencesNum = this->object->referencesNum + 1;
  iVar2 = (*this->object->_vptr_Object[2])();
  bVar1 = std::set<Object_*,_std::less<Object_*>,_std::allocator<Object_*>_>::empty
                    ((set<Object_*,_std::less<Object_*>,_std::allocator<Object_*>_> *)
                     CONCAT44(extraout_var,iVar2));
  if (!bVar1) {
    iVar2 = (*this->object->_vptr_Object[2])();
    __end2 = std::set<Object_*,_std::less<Object_*>,_std::allocator<Object_*>_>::begin
                       ((set<Object_*,_std::less<Object_*>,_std::allocator<Object_*>_> *)
                        CONCAT44(extraout_var_00,iVar2));
    dep = (Object *)
          std::set<Object_*,_std::less<Object_*>,_std::allocator<Object_*>_>::end
                    ((set<Object_*,_std::less<Object_*>,_std::allocator<Object_*>_> *)
                     CONCAT44(extraout_var_00,iVar2));
    while (bVar1 = std::operator!=(&__end2,(_Self *)&dep), bVar1) {
      ppOVar3 = std::_Rb_tree_const_iterator<Object_*>::operator*(&__end2);
      (*ppOVar3)->referencesNum = (*ppOVar3)->referencesNum + 1;
      std::_Rb_tree_const_iterator<Object_*>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

R::R(Object* obj) {
	GC::logger.debug("NEW Reference of object ", obj, " Reference num: ", to_string(obj->referencesNum + 1));
	this->object = obj;
	this->object->referencesNum++;
	if (!this->object->getDepends().empty()) {
        for (auto dep : this->object->getDepends()) {
            dep->referencesNum++;
        }
	}
}